

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::OptionSpecException::OptionSpecException(OptionSpecException *this,string *message)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)message);
  OptionException::OptionException(&this->super_OptionException,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_OptionException = &PTR__OptionException_0013ed80;
  return;
}

Assistant:

explicit OptionSpecException(const std::string& message)
    : OptionException(message)
    {
    }